

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.cpp
# Opt level: O3

int __thiscall
gmlc::networking::TcpAcceptor::connect(TcpAcceptor *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  AcceptingStates AVar1;
  int iVar2;
  undefined8 uVar3;
  int *piVar4;
  int iVar5;
  undefined4 in_register_00000034;
  long lVar6;
  bool bVar7;
  int local_58 [2];
  undefined8 local_50;
  long local_48;
  timespec local_40;
  
  local_48 = CONCAT44(in_register_00000034,__fd);
  if ((this->state)._M_i == HALTED) {
    LOCK();
    (this->state)._M_i = OPENED;
    UNLOCK();
  }
  LOCK();
  bVar7 = (this->state)._M_i == OPENED;
  if (bVar7) {
    (this->state)._M_i = CONNECTING;
  }
  UNLOCK();
  if (bVar7) {
    uVar3 = std::_V2::system_category();
    iVar5 = (int)this + 0x38;
    local_58[0] = 0;
    local_50 = uVar3;
    asio::detail::reactive_socket_service<asio::ip::tcp>::bind
              ((this->acceptor_).impl_.service_,iVar5,(sockaddr *)&this->endpoint_,
               (socklen_t)local_58);
    if (local_58[0] != 0) {
      lVar6 = 0;
      do {
        if (local_48 < lVar6) {
          LOCK();
          (this->state)._M_i = OPENED;
          UNLOCK();
          return 0;
        }
        local_40.tv_sec = 0;
        local_40.tv_nsec = 200000000;
        do {
          iVar2 = nanosleep(&local_40,&local_40);
          if (iVar2 != -1) break;
          piVar4 = __errno_location();
        } while (*piVar4 == 4);
        lVar6 = lVar6 + 200;
        local_58[0] = 0;
        local_50 = uVar3;
        asio::detail::reactive_socket_service<asio::ip::tcp>::bind
                  ((this->acceptor_).impl_.service_,iVar5,(sockaddr *)&this->endpoint_,
                   (socklen_t)local_58);
      } while (local_58[0] != 0);
    }
    LOCK();
    AVar1 = (this->state)._M_i;
    (this->state)._M_i = CONNECTED;
    UNLOCK();
    iVar5 = (int)CONCAT71((uint7)(uint3)(AVar1 >> 8),1);
  }
  else {
    AVar1 = (this->state)._M_i;
    iVar5 = CONCAT31((int3)(AVar1 >> 8),AVar1 == CONNECTED);
  }
  return iVar5;
}

Assistant:

bool TcpAcceptor::connect(std::chrono::milliseconds timeOut)
{
    if (state == AcceptingStates::HALTED) {
        state = AcceptingStates::OPENED;
    }
    AcceptingStates exp = AcceptingStates::OPENED;
    if (state.compare_exchange_strong(exp, AcceptingStates::CONNECTING)) {
        bool bindsuccess = false;
        std::chrono::milliseconds tcount{0};
        while (!bindsuccess) {
            std::error_code ec;
            acceptor_.bind(endpoint_, ec);
            if (ec) {
                if (tcount > timeOut) {
                    state = AcceptingStates::OPENED;
                    break;
                }
                std::this_thread::sleep_for(std::chrono::milliseconds(200));
                tcount += std::chrono::milliseconds(200);
            } else {
                state = AcceptingStates::CONNECTED;
                bindsuccess = true;
            }
        }
        return bindsuccess;
    }
    return (state == AcceptingStates::CONNECTED);
}